

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

bool rr::LineRasterUtil::doesLineSegmentExitDiamond
               (SubpixelLineSegment *line,Vector<long,_2> *diamondCenter)

{
  Vector<long,_2> *p_00;
  DiamondBound *v0;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  LINE_SIDE LVar5;
  LINE_SIDE LVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  Vector<long,_2> *b;
  Vector<long,_2> *v1;
  Vector<long,_2> v_1;
  Vector<long,_2> p;
  Vector<long,_2> u1;
  Vector<long,_2> u2;
  undefined1 local_188 [16];
  DiamondCorners corners [4];
  DiamondBound bounds [4];
  Vector<long,_2> local_50;
  Vector<long,_2> local_40;
  
  SubpixelLineSegment::direction((SubpixelLineSegment *)bounds);
  tcu::operator-(diamondCenter,&line->m_v0);
  lVar9 = corners[0].dp.m_data[1] * bounds[0].p0.m_data[0] -
          corners[0].dp.m_data[0] * bounds[0].p0.m_data[1];
  uVar7 = bounds[0].p0.m_data[0] * bounds[0].p0.m_data[0] +
          bounds[0].p0.m_data[1] * bounds[0].p0.m_data[1];
  uVar10 = uVar7 >> 0x2e;
  if ((uVar10 != 0) || (0xfffffffe95f61998 < lVar9 - 0xb504f334U)) {
    lVar8 = uVar7 * 0x10000;
    if (uVar10 != 0) {
      lVar8 = 0;
    }
    if (((lVar9 - 0xb504f334U < 0xfffffffe95f61999) || (uVar10 != 0)) || (lVar9 * lVar9 <= lVar8)) {
      corners[0].dp.m_data[0] = 0;
      corners[0].dp.m_data[1] = -0x80;
      tcu::operator+(diamondCenter,&corners[0].dp);
      v1 = &bounds[0].p1;
      v_1.m_data[0] = -0x80;
      v_1.m_data[1] = 0;
      tcu::operator+(diamondCenter,&v_1);
      lVar9 = 0;
      bounds[0].edgeInclusive = false;
      u1.m_data[0] = -0x80;
      u1.m_data[1] = 0;
      tcu::operator+(diamondCenter,&u1);
      u2.m_data[0] = 0;
      u2.m_data[1] = 0x80;
      tcu::operator+(diamondCenter,&u2);
      bounds[1].edgeInclusive = false;
      local_188._0_8_ = 0;
      local_188._8_8_ = 0x80;
      tcu::operator+(diamondCenter,(Vector<long,_2> *)local_188);
      p.m_data[0] = 0x80;
      p.m_data[1] = 0;
      tcu::operator+(diamondCenter,&p);
      bounds[2].edgeInclusive = true;
      local_40.m_data[0] = 0x80;
      local_40.m_data[1] = 0;
      tcu::operator+(diamondCenter,&local_40);
      local_50.m_data[0] = 0;
      local_50.m_data[1] = -0x80;
      tcu::operator+(diamondCenter,&local_50);
      corners[0].dp.m_data[0] = 0;
      corners[0].dp.m_data[1] = -0x80;
      corners[0].pointInclusive = false;
      corners[0].lineBehavior = CORNER_EDGE_CASE_HIT_SECOND_QUARTER;
      corners[0].startBehavior = CORNER_START_CASE_POSITIVE_Y_45;
      corners[0].endBehavior = CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER;
      corners[1].dp.m_data[0] = -0x80;
      corners[1].dp.m_data[1] = 0;
      corners[1].pointInclusive = false;
      corners[1].lineBehavior = CORNER_EDGE_CASE_NONE;
      corners[1].startBehavior = CORNER_START_CASE_NONE;
      corners[1].endBehavior = CORNER_END_CASE_DIRECTION;
      corners[2].dp.m_data[0] = 0;
      corners[2].dp.m_data[1] = 0x80;
      corners[2].pointInclusive = false;
      corners[2].lineBehavior = CORNER_EDGE_CASE_HIT_FIRST_QUARTER;
      corners[2].startBehavior = CORNER_START_CASE_NEGATIVE_Y_45;
      corners[2].endBehavior = CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER;
      corners[3].dp.m_data[0] = 0x80;
      corners[3].dp.m_data[1] = 0;
      bounds[3].edgeInclusive = true;
      corners[3].pointInclusive = true;
      corners[3].lineBehavior = CORNER_EDGE_CASE_HIT;
      corners[3].startBehavior = CORNER_START_CASE_OUTSIDE;
      corners[3].endBehavior = CORNER_END_CASE_NONE;
      p_00 = &line->m_v1;
      do {
        if (lVar9 == 0x80) {
          lVar9 = 4;
          do {
            bVar1 = lVar9 != 0;
            lVar9 = lVar9 + -1;
            if (!bVar1) {
              return bVar1;
            }
            v0 = (DiamondBound *)(v1 + -1);
            SubpixelLineSegment::SubpixelLineSegment
                      ((SubpixelLineSegment *)&v_1,(Vector<long,_2> *)v0,v1);
            bVar2 = vertexOnLeftSideOfLine(&line->m_v0,(SubpixelLineSegment *)&v_1);
            if (bVar2) {
              bVar2 = false;
            }
            else {
              bVar2 = true;
              if (*(bool *)(v1 + 1) == true) {
                SubpixelLineSegment::SubpixelLineSegment
                          ((SubpixelLineSegment *)&u1,(Vector<long,_2> *)v0,v1);
                bVar2 = vertexOnLine(&line->m_v0,(SubpixelLineSegment *)&u1);
                bVar2 = !bVar2;
              }
            }
            SubpixelLineSegment::SubpixelLineSegment
                      ((SubpixelLineSegment *)&v_1,(Vector<long,_2> *)v0,v1);
            bVar3 = vertexOnLeftSideOfLine(p_00,(SubpixelLineSegment *)&v_1);
            if (!bVar3) {
              if (*(bool *)(v1 + 1) == true) {
                SubpixelLineSegment::SubpixelLineSegment
                          ((SubpixelLineSegment *)&u1,(Vector<long,_2> *)v0,v1);
                bVar3 = vertexOnLine(p_00,(SubpixelLineSegment *)&u1);
              }
              else {
                bVar3 = false;
              }
              if (!bVar2 && bVar3 == false) {
                LVar5 = getVertexSide((Vector<long,_2> *)v0,line);
                LVar6 = getVertexSide(v1,line);
                if (((LVar5 != LVar6) && (LVar5 != LINE_SIDE_INTERSECT)) &&
                   (LVar6 != LINE_SIDE_INTERSECT)) {
                  return bVar1;
                }
              }
            }
            v1 = (Vector<long,_2> *)((long)(v1 + 2) + 8);
          } while( true );
        }
        b = (Vector<long,_2> *)((long)corners[0].dp.m_data + lVar9);
        tcu::operator+(diamondCenter,b);
        bVar1 = vertexOnLine(&p,line);
        if (bVar1) {
          SubpixelLineSegment::direction((SubpixelLineSegment *)&v_1);
          tcu::operator-(&p,&line->m_v0);
          tcu::operator-(&p,p_00);
          if ((v_1.m_data[1] != 0 || v_1.m_data[0] != 0) &&
             (lVar8 = tcu::dot<long,2>(&v_1,&u1), -1 < lVar8)) {
            tcu::operator-(&v_1);
            lVar8 = tcu::dot<long,2>((Vector<long,_2> *)local_188,&u2);
            if (-1 < lVar8) {
              if (((p.m_data[0] != (line->m_v0).m_data[0]) ||
                  (p.m_data[1] != (line->m_v0).m_data[1])) &&
                 ((p.m_data[0] != (line->m_v1).m_data[0] || (p.m_data[1] != (line->m_v1).m_data[1]))
                 )) {
                iVar4 = *(int *)((long)(&corners[0].dp + 1) + lVar9 + 4);
                if (iVar4 == 1) {
                  return true;
                }
                if (iVar4 == 2) {
                  SubpixelLineSegment::direction((SubpixelLineSegment *)&v_1);
                  lVar8 = v_1.m_data[0];
                  SubpixelLineSegment::direction((SubpixelLineSegment *)&u1);
                  if (lVar8 * u1.m_data[1] < 1) {
                    return true;
                  }
                  iVar4 = *(int *)((long)(&corners[0].dp + 1) + lVar9 + 4);
                }
                if (iVar4 == 3) {
                  SubpixelLineSegment::direction((SubpixelLineSegment *)&v_1);
                  lVar8 = v_1.m_data[0];
                  SubpixelLineSegment::direction((SubpixelLineSegment *)&u1);
                  if (0 < lVar8 * u1.m_data[1]) {
                    return true;
                  }
                }
              }
              bVar1 = lineInCornerAngleRange(line,b);
              if (bVar1) {
                if (*(bool *)((long)(&corners[0].dp + 1) + lVar9) == false) {
                  if (p.m_data[0] != (line->m_v0).m_data[0]) {
                    return true;
                  }
                  lVar8 = (line->m_v0).m_data[1];
                }
                else {
                  if (p.m_data[0] != (line->m_v1).m_data[0]) {
                    return true;
                  }
                  lVar8 = (line->m_v1).m_data[1];
                }
                if (p.m_data[1] != lVar8) {
                  return true;
                }
              }
              if (((p.m_data[0] == p_00->m_data[0]) && (p.m_data[1] == (line->m_v1).m_data[1])) &&
                 (((*(int *)((long)(&corners[0].dp + 1) + lVar9 + 0xc) - 1U < 3 &&
                   ((bVar1 = lineInCornerAngleRange(line,b), bVar1 ||
                    (((*(int *)((long)(&corners[0].dp + 1) + lVar9 + 0xc) == 2 &&
                      (SubpixelLineSegment::direction((SubpixelLineSegment *)&v_1),
                      v_1.m_data[0] < 0)) &&
                     (SubpixelLineSegment::direction((SubpixelLineSegment *)&u1), 0 < u1.m_data[1]))
                    )))) || (((*(int *)((long)(&corners[0].dp + 1) + lVar9 + 0xc) == 3 &&
                              (SubpixelLineSegment::direction((SubpixelLineSegment *)&v_1),
                              0 < v_1.m_data[0])) &&
                             (SubpixelLineSegment::direction((SubpixelLineSegment *)&u1),
                             0 < u1.m_data[1])))))) {
                return true;
              }
              if ((p.m_data[0] == (line->m_v0).m_data[0]) && (p.m_data[1] == (line->m_v0).m_data[1])
                 ) {
                iVar4 = *(int *)((long)(&corners[0].dp + 1) + lVar9 + 8);
                if (iVar4 == 1) {
                  bVar1 = lineInCornerOutsideAngleRange(line,b);
                  if (bVar1) {
                    return true;
                  }
                  iVar4 = *(int *)((long)(&corners[0].dp + 1) + lVar9 + 8);
                }
                if (((iVar4 == 2) &&
                    (SubpixelLineSegment::direction((SubpixelLineSegment *)&v_1), 0 < v_1.m_data[0])
                    ) && (SubpixelLineSegment::direction((SubpixelLineSegment *)&u1),
                         0 < u1.m_data[1])) {
                  SubpixelLineSegment::direction((SubpixelLineSegment *)&u2);
                  lVar8 = u2.m_data[1];
                  SubpixelLineSegment::direction((SubpixelLineSegment *)local_188);
                  if (lVar8 <= (long)local_188._0_8_) {
                    return true;
                  }
                }
                if (((*(int *)((long)(&corners[0].dp + 1) + lVar9 + 8) == 3) &&
                    (SubpixelLineSegment::direction((SubpixelLineSegment *)&v_1), 0 < v_1.m_data[0])
                    ) && (SubpixelLineSegment::direction((SubpixelLineSegment *)&u1),
                         u1.m_data[1] < 1)) {
                  SubpixelLineSegment::direction((SubpixelLineSegment *)&u2);
                  lVar8 = -u2.m_data[1];
                  SubpixelLineSegment::direction((SubpixelLineSegment *)local_188);
                  if (lVar8 <= (long)local_188._0_8_) {
                    return true;
                  }
                }
              }
            }
          }
        }
        lVar9 = lVar9 + 0x20;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool doesLineSegmentExitDiamond (const SubpixelLineSegment& line, const tcu::Vector<deInt64,2>& diamondCenter)
{
	DE_ASSERT(isTheCenterOfTheFragment(diamondCenter));

	// Diamond Center is at diamondCenter in subpixel coords

	const deInt64 halfPixel = 1ll << (RASTERIZER_SUBPIXEL_BITS-1);

	// Reject distant diamonds early
	{
		const tcu::Vector<deInt64,2>	u				= line.direction();
		const tcu::Vector<deInt64,2>	v				= (diamondCenter - line.m_v0);
		const deInt64					crossProduct	= (u.x() * v.y() - u.y() * v.x());

		// crossProduct = |p| |l| sin(theta)
		// distanceFromLine = |p| sin(theta)
		// => distanceFromLine = crossProduct / |l|
		//
		// |distanceFromLine| > C
		// => distanceFromLine^2 > C^2
		// => crossProduct^2 / |l|^2 > C^2
		// => crossProduct^2 > |l|^2 * C^2

		const deInt64	floorSqrtMaxInt64			= 3037000499LL; //!< floor(sqrt(MAX_INT64))

		const deInt64	broadRejectDistance			= 2 * halfPixel;
		const deInt64	broadRejectDistanceSquared	= broadRejectDistance * broadRejectDistance;
		const bool		crossProductOverflows		= (crossProduct > floorSqrtMaxInt64 || crossProduct < -floorSqrtMaxInt64);
		const deInt64	crossProductSquared			= (crossProductOverflows) ? (0) : (crossProduct * crossProduct); // avoid overflow
		const deInt64	lineLengthSquared			= tcu::lengthSquared(u);
		const bool		limitValueCouldOverflow		= ((64 - deClz64(lineLengthSquared)) + (64 - deClz64(broadRejectDistanceSquared))) > 63;
		const deInt64	limitValue					= (limitValueCouldOverflow) ? (0) : (lineLengthSquared * broadRejectDistanceSquared); // avoid overflow

		// only cross overflows
		if (crossProductOverflows && !limitValueCouldOverflow)
			return false;

		// both representable
		if (!crossProductOverflows && !limitValueCouldOverflow)
		{
			if (crossProductSquared > limitValue)
				return false;
		}
	}

	const struct DiamondBound
	{
		tcu::Vector<deInt64,2>	p0;
		tcu::Vector<deInt64,2>	p1;
		bool					edgeInclusive; // would a point on the bound be inside of the region
	} bounds[] =
	{
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				-halfPixel),	diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(-halfPixel,	0),				diamondCenter + tcu::Vector<deInt64,2>(0,			halfPixel),		 false	},
		{ diamondCenter + tcu::Vector<deInt64,2>(0,				halfPixel),		diamondCenter + tcu::Vector<deInt64,2>(halfPixel,	0),				 true	},
		{ diamondCenter + tcu::Vector<deInt64,2>(halfPixel,		0),				diamondCenter + tcu::Vector<deInt64,2>(0,			-halfPixel),	 true	},
	};

	const struct DiamondCorners
	{
		enum CORNER_EDGE_CASE_BEHAVIOR
		{
			CORNER_EDGE_CASE_NONE,							// if the line intersects just a corner, no entering or exiting
			CORNER_EDGE_CASE_HIT,							// if the line intersects just a corner, entering and exit
			CORNER_EDGE_CASE_HIT_FIRST_QUARTER,				// if the line intersects just a corner and the line has either endpoint in (+X,-Y) direction (preturbing moves the line inside)
			CORNER_EDGE_CASE_HIT_SECOND_QUARTER				// if the line intersects just a corner and the line has either endpoint in (+X,+Y) direction (preturbing moves the line inside)
		};
		enum CORNER_START_CASE_BEHAVIOR
		{
			CORNER_START_CASE_NONE,							// the line starting point is outside, no exiting
			CORNER_START_CASE_OUTSIDE,						// exit, if line does not intersect the region (preturbing moves the start point inside)
			CORNER_START_CASE_POSITIVE_Y_45,				// exit, if line the angle of line vector and X-axis is in range (0, 45] in positive Y side.
			CORNER_START_CASE_NEGATIVE_Y_45					// exit, if line the angle of line vector and X-axis is in range [0, 45] in negative Y side.
		};
		enum CORNER_END_CASE_BEHAVIOR
		{
			CORNER_END_CASE_NONE,							// end is inside, no exiting (preturbing moves the line end inside)
			CORNER_END_CASE_DIRECTION,						// exit, if line intersected the region (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER,	// exit, if line intersected the region, or line originates from (+X,-Y) direction (preturbing moves the line end outside)
			CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER	// exit, if line intersected the region, or line originates from (+X,+Y) direction (preturbing moves the line end outside)
		};

		tcu::Vector<deInt64,2>		dp;
		bool						pointInclusive;			// would a point in this corner intersect with the region
		CORNER_EDGE_CASE_BEHAVIOR	lineBehavior;			// would a line segment going through this corner intersect with the region
		CORNER_START_CASE_BEHAVIOR	startBehavior;			// how the corner behaves if the start point at the corner
		CORNER_END_CASE_BEHAVIOR	endBehavior;			// how the corner behaves if the end point at the corner
	} corners[] =
	{
		{ tcu::Vector<deInt64,2>(0,				-halfPixel),	false,	DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER,	DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER},
		{ tcu::Vector<deInt64,2>(-halfPixel,	0),				false,	DiamondCorners::CORNER_EDGE_CASE_NONE,					DiamondCorners::CORNER_START_CASE_NONE,				DiamondCorners::CORNER_END_CASE_DIRECTION					},
		{ tcu::Vector<deInt64,2>(0,				halfPixel),		false,	DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER,		DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45,	DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER	},
		{ tcu::Vector<deInt64,2>(halfPixel,		0),				true,	DiamondCorners::CORNER_EDGE_CASE_HIT,					DiamondCorners::CORNER_START_CASE_OUTSIDE,			DiamondCorners::CORNER_END_CASE_NONE						},
	};

	// Corner cases at the corners
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(corners); ++ndx)
	{
		const tcu::Vector<deInt64,2> p	= diamondCenter + corners[ndx].dp;
		const bool intersectsAtCorner	= LineRasterUtil::vertexOnLineSegment(p, line);

		if (!intersectsAtCorner)
			continue;

		// line segment body intersects with the corner
		if (p != line.m_v0 && p != line.m_v1)
		{
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT)
				return true;

			// endpoint in (+X, -Y) (X or Y may be 0) direction <==> x*y <= 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_FIRST_QUARTER &&
				(line.direction().x() * line.direction().y()) <= 0)
				return true;

			// endpoint in (+X, +Y) (Y > 0) direction <==> x*y > 0
			if (corners[ndx].lineBehavior == DiamondCorners::CORNER_EDGE_CASE_HIT_SECOND_QUARTER &&
				(line.direction().x() * line.direction().y()) > 0)
				return true;
		}

		// line exits the area at the corner
		if (lineInCornerAngleRange(line, corners[ndx].dp))
		{
			const bool startIsInside = corners[ndx].pointInclusive || p != line.m_v0;
			const bool endIsOutside = !corners[ndx].pointInclusive || p != line.m_v1;

			// starting point is inside the region and end endpoint is outside
			if (startIsInside && endIsOutside)
				return true;
		}

		// line end is at the corner
		if (p == line.m_v1)
		{
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER ||
				corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER)
			{
				// did the line intersect the region
				if (lineInCornerAngleRange(line, corners[ndx].dp))
					return true;
			}

			// due to the perturbed endpoint, lines at this the angle will cause and enter-exit pair
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_FIRST_QUARTER &&
				line.direction().x() < 0 &&
				line.direction().y() > 0)
				return true;
			if (corners[ndx].endBehavior == DiamondCorners::CORNER_END_CASE_DIRECTION_AND_SECOND_QUARTER &&
				line.direction().x() > 0 &&
				line.direction().y() > 0)
				return true;
		}

		// line start is at the corner
		if (p == line.m_v0)
		{
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_OUTSIDE)
			{
				// if the line is not going inside, it will exit
				if (lineInCornerOutsideAngleRange(line, corners[ndx].dp))
					return true;
			}

			// exit, if line the angle between line vector and X-axis is in range (0, 45] in positive Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_POSITIVE_Y_45 &&
				line.direction().x() > 0 &&
				line.direction().y() > 0 &&
				line.direction().y() <= line.direction().x())
				return true;

			// exit, if line the angle between line vector and X-axis is in range [0, 45] in negative Y side.
			if (corners[ndx].startBehavior == DiamondCorners::CORNER_START_CASE_NEGATIVE_Y_45 &&
				 line.direction().x() > 0 &&
				 line.direction().y() <= 0 &&
				-line.direction().y() <= line.direction().x())
				return true;
		}
	}

	// Does the line intersect boundary at the left == exits the diamond
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(bounds); ++ndx)
	{
		const bool startVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v0, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));
		const bool endVertexInside =	LineRasterUtil::vertexOnLeftSideOfLine						(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)) ||
										(bounds[ndx].edgeInclusive && LineRasterUtil::vertexOnLine	(line.m_v1, LineRasterUtil::SubpixelLineSegment(bounds[ndx].p0, bounds[ndx].p1)));

		// start must be on inside this half space (left or at the inclusive boundary)
		if (!startVertexInside)
			continue;

		// end must be outside of this half-space (right or at non-inclusive boundary)
		if (endVertexInside)
			continue;

		// Does the line via v0 and v1 intersect the line segment p0-p1
		// <==> p0 and p1 are the different sides (LEFT, RIGHT) of the v0-v1 line.
		// Corners are not allowed, they are checked already
		LineRasterUtil::LINE_SIDE sideP0 = LineRasterUtil::getVertexSide(bounds[ndx].p0, line);
		LineRasterUtil::LINE_SIDE sideP1 = LineRasterUtil::getVertexSide(bounds[ndx].p1, line);

		if (sideP0 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP1 != LineRasterUtil::LINE_SIDE_INTERSECT &&
			sideP0 != sideP1)
			return true;
	}

	return false;
}